

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VertexBuffer.cpp
# Opt level: O0

void __thiscall sf::VertexBuffer::VertexBuffer(VertexBuffer *this,VertexBuffer *copy)

{
  bool bVar1;
  ostream *poVar2;
  VertexBuffer *copy_local;
  VertexBuffer *this_local;
  
  Drawable::Drawable(&this->super_Drawable);
  GlResource::GlResource((GlResource *)this);
  (this->super_Drawable)._vptr_Drawable = (_func_int **)&PTR__VertexBuffer_00333278;
  this->m_buffer = 0;
  this->m_size = 0;
  this->m_primitiveType = copy->m_primitiveType;
  this->m_usage = copy->m_usage;
  if ((copy->m_buffer != 0) && (copy->m_size != 0)) {
    bVar1 = create(this,copy->m_size);
    if (bVar1) {
      bVar1 = update(this,copy);
      if (!bVar1) {
        poVar2 = err();
        poVar2 = std::operator<<(poVar2,"Could not copy vertex buffer");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
    }
    else {
      poVar2 = err();
      poVar2 = std::operator<<(poVar2,"Could not create vertex buffer for copying");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

VertexBuffer::VertexBuffer(const VertexBuffer& copy) :
m_buffer       (0),
m_size         (0),
m_primitiveType(copy.m_primitiveType),
m_usage        (copy.m_usage)
{
    if (copy.m_buffer && copy.m_size)
    {
        if (!create(copy.m_size))
        {
            err() << "Could not create vertex buffer for copying" << std::endl;
            return;
        }

        if (!update(copy))
            err() << "Could not copy vertex buffer" << std::endl;
    }
}